

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiFile.cpp
# Opt level: O0

int smf::MidiFile::ticksearch(void *A,void *B)

{
  _TickTime *b;
  _TickTime *a;
  void *B_local;
  void *A_local;
  
  if (*A < *B) {
    A_local._4_4_ = -1;
  }
  else if (*B < *A) {
    A_local._4_4_ = 1;
  }
  else {
    A_local._4_4_ = 0;
  }
  return A_local._4_4_;
}

Assistant:

int MidiFile::ticksearch(const void* A, const void* B) {
	_TickTime& a = *((_TickTime*)A);
	_TickTime& b = *((_TickTime*)B);

	if (a.tick < b.tick) {
		return -1;
	} else if (a.tick > b.tick) {
		return 1;
	}
	return 0;
}